

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O3

bool __thiscall SuperCardPro::ReadExact(SuperCardPro *this,void *buf,int len)

{
  bool bVar1;
  char cVar2;
  uint in_EAX;
  uint uVar4;
  int bytes_read;
  undefined8 uStack_28;
  int iVar3;
  
  uStack_28 = (ulong)in_EAX;
  if (len < 1) {
    cVar2 = '\x01';
  }
  else {
    do {
      iVar3 = (*this->_vptr_SuperCardPro[2])(this,buf,(ulong)(uint)len,(long)&uStack_28 + 4);
      cVar2 = (char)iVar3;
      if (cVar2 == '\0') {
        return false;
      }
      buf = (void *)((long)buf + (long)uStack_28._4_4_);
      uVar4 = len - uStack_28._4_4_;
      bVar1 = uStack_28._4_4_ <= len;
      len = uVar4;
    } while (uVar4 != 0 && bVar1);
  }
  return (bool)cVar2;
}

Assistant:

bool SuperCardPro::ReadExact(void* buf, int len)
{
    uint8_t* p = reinterpret_cast<uint8_t*>(buf);
    auto bytes_read = 0;

    while (len > 0)
    {
        if (!Read(p, len, &bytes_read))
            return false;

        p += bytes_read;
        len -= bytes_read;
    }
    return true;
}